

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O1

void __thiscall Poisson::setParameter(Poisson *this,string *name,string *value)

{
  int iVar1;
  stringstream parameter;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(value->_M_dataplus)._M_p,value->_M_string_length);
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    std::istream::_M_extract<double>((double *)local_1a0);
    this->poissonRate =
         ((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
          super_TimeDependent.xTime)->dt * this->poissonRate;
  }
  else {
    Parametric::setParameter((Parametric *)this,name,value);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void Poisson::setParameter(const string& name, const string& value)
{
	stringstream parameter;
	parameter << value;
	if (name=="rate") {
		parameter >> poissonRate;
		poissonRate *= xTime->dt;
	}
	else
		StochasticEventGenerator::setParameter( name, value );
}